

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall
ThreadContext::RegisterUniquePropertyGuard
          (ThreadContext *this,PropertyId propertyId,
          RecyclerWeakReference<Js::PropertyGuard> *guardWeakRef)

{
  Type pcVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  PropertyRecord *propertyRecord;
  PropertyGuardEntry *pPVar5;
  char16_t *pcVar6;
  RecyclerWeakReference<Js::PropertyGuard> *local_38;
  RecyclerWeakReference<Js::PropertyGuard> *guardWeakRef_local;
  bool foundExistingGuard;
  
  local_38 = guardWeakRef;
  bVar3 = IsActivePropertyId(this,propertyId);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xde6,"(IsActivePropertyId(propertyId))","IsActivePropertyId(propertyId)");
    if (!bVar3) goto LAB_00714863;
    *puVar4 = 0;
  }
  if (guardWeakRef == (RecyclerWeakReference<Js::PropertyGuard> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xde7,"(guardWeakRef != nullptr)","guardWeakRef != nullptr");
    if (!bVar3) goto LAB_00714863;
    *puVar4 = 0;
  }
  pcVar1 = (guardWeakRef->super_RecyclerWeakReferenceBase).strongRef;
  if (pcVar1 == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xdea,"(guard != nullptr)","guard != nullptr");
    if (!bVar3) {
LAB_00714863:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  propertyRecord = GetPropertyName(this,propertyId);
  pPVar5 = EnsurePropertyGuardEntry(this,propertyRecord,(bool *)((long)&guardWeakRef_local + 7));
  JsUtil::
  BaseHashSet<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Item(&pPVar5->uniqueGuards,&local_38);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,TracePropertyGuardsPhase);
  if ((bVar3) ||
     ((bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,FixedMethodsPhase), bVar3 &&
      (DAT_0145948a == '\x01')))) {
    pcVar6 = L"new";
    if (guardWeakRef_local._7_1_ != '\0') {
      pcVar6 = L"existing";
    }
    Output::Print(L"FixedFields: registered unique guard: name: %s, address: 0x%p, value: 0x%p, value address: 0x%p, %s entry\n"
                  ,propertyRecord + 1,pcVar1,*(undefined8 *)pcVar1,pcVar1,pcVar6);
    Output::Flush();
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,TracePropertyGuardsPhase);
  if (!bVar3) {
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,FixedMethodsPhase);
    if (!bVar3) {
      return;
    }
    if (DAT_0145948a != '\x01') {
      return;
    }
  }
  pcVar6 = L"new";
  if (guardWeakRef_local._7_1_ != '\0') {
    pcVar6 = L"existing";
  }
  Output::Print(L"FixedFields: registered unique guard: name: %s, value: 0x%p, %s entry\n",
                propertyRecord + 1,*(undefined8 *)pcVar1,pcVar6);
  Output::Flush();
  return;
}

Assistant:

void
ThreadContext::RegisterUniquePropertyGuard(Js::PropertyId propertyId, RecyclerWeakReference<Js::PropertyGuard>* guardWeakRef)
{
    Assert(IsActivePropertyId(propertyId));
    Assert(guardWeakRef != nullptr);

    Js::PropertyGuard* guard = guardWeakRef->Get();
    Assert(guard != nullptr);

    const Js::PropertyRecord * propertyRecord = GetPropertyName(propertyId);

    bool foundExistingGuard;


    PropertyGuardEntry* entry = EnsurePropertyGuardEntry(propertyRecord, foundExistingGuard);

    entry->uniqueGuards.Item(guardWeakRef);

    if (PHASE_TRACE1(Js::TracePropertyGuardsPhase) || PHASE_VERBOSE_TRACE1(Js::FixedMethodsPhase))
    {
        Output::Print(_u("FixedFields: registered unique guard: name: %s, address: 0x%p, value: 0x%p, value address: 0x%p, %s entry\n"),
            propertyRecord->GetBuffer(), guard, guard->GetValue(), guard->GetAddressOfValue(), foundExistingGuard ? _u("existing") : _u("new"));
        Output::Flush();
    }

    if (PHASE_TESTTRACE1(Js::TracePropertyGuardsPhase) || PHASE_VERBOSE_TESTTRACE1(Js::FixedMethodsPhase))
    {
        Output::Print(_u("FixedFields: registered unique guard: name: %s, value: 0x%p, %s entry\n"),
            propertyRecord->GetBuffer(), guard->GetValue(), foundExistingGuard ? _u("existing") : _u("new"));
        Output::Flush();
    }
}